

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Enum::InternalSwap(Enum *this,Enum *other)

{
  int iVar1;
  void *pvVar2;
  SourceContext *pSVar3;
  string *psVar4;
  UnknownFieldSet *other_00;
  Arena *arena;
  
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_0031cec7;
LAB_0031ceb6:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_0031ceb6;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
LAB_0031cec7:
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enumvalue_).super_RepeatedPtrFieldBase,
             &(other->enumvalue_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(other->options_).super_RepeatedPtrFieldBase);
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar4 = internal::ArenaStringPtr::Mutable
                       (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                        arena);
    internal::ArenaStringPtr::Mutable
              (&other->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
    std::__cxx11::string::swap((string *)psVar4);
  }
  pSVar3 = this->source_context_;
  this->source_context_ = other->source_context_;
  other->source_context_ = pSVar3;
  iVar1 = this->syntax_;
  this->syntax_ = other->syntax_;
  other->syntax_ = iVar1;
  return;
}

Assistant:

void Enum::InternalSwap(Enum* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  enumvalue_.InternalSwap(&other->enumvalue_);
  options_.InternalSwap(&other->options_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Enum, syntax_)
      + sizeof(Enum::syntax_)
      - PROTOBUF_FIELD_OFFSET(Enum, source_context_)>(
          reinterpret_cast<char*>(&source_context_),
          reinterpret_cast<char*>(&other->source_context_));
}